

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_discard.c
# Opt level: O2

void zip_discard(zip_t *za)

{
  long lVar1;
  ulong uVar2;
  
  if (za != (zip_t *)0x0) {
    if (za->src != (zip_source_t *)0x0) {
      zip_source_close(za->src);
      zip_source_free(za->src);
    }
    free(za->default_password);
    _zip_string_free(za->comment_orig);
    _zip_string_free(za->comment_changes);
    _zip_hash_free(za->names);
    if (za->entry != (zip_entry_t *)0x0) {
      lVar1 = 0;
      for (uVar2 = 0; uVar2 < za->nentry; uVar2 = uVar2 + 1) {
        _zip_entry_finalize((zip_entry_t *)((long)&za->entry->orig + lVar1));
        lVar1 = lVar1 + 0x20;
      }
      free(za->entry);
    }
    for (uVar2 = 0; uVar2 < za->nopen_source; uVar2 = uVar2 + 1) {
      _zip_source_invalidate(za->open_source[uVar2]);
    }
    free(za->open_source);
    _zip_progress_free(za->progress);
    zip_error_fini(&za->error);
    free(za);
    return;
  }
  return;
}

Assistant:

void
zip_discard(zip_t *za) {
    zip_uint64_t i;

    if (za == NULL)
	return;

    if (za->src) {
	zip_source_close(za->src);
	zip_source_free(za->src);
    }

    free(za->default_password);
    _zip_string_free(za->comment_orig);
    _zip_string_free(za->comment_changes);

    _zip_hash_free(za->names);

    if (za->entry) {
	for (i = 0; i < za->nentry; i++)
	    _zip_entry_finalize(za->entry + i);
	free(za->entry);
    }

    for (i = 0; i < za->nopen_source; i++) {
	_zip_source_invalidate(za->open_source[i]);
    }
    free(za->open_source);

    _zip_progress_free(za->progress);

    zip_error_fini(&za->error);

    free(za);

    return;
}